

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintTo(char *s,ostream *os)

{
  ostream *in_RDI;
  char *unaff_retaddr;
  
  anon_unknown_37::PrintCStringTo<char>(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void PrintTo(const char* s, ostream* os) { PrintCStringTo(s, os); }